

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTFAsset.h
# Opt level: O2

uint glTF::ComponentTypeSize(ComponentType t)

{
  DeadlyImportError *this;
  allocator<char> local_31;
  string err;
  
  if ((t - ComponentType_BYTE < 7) && ((0x6fU >> (t & 0x1f) & 1) != 0)) {
    return *(uint *)(&DAT_005a6d0c + (ulong)(t - ComponentType_BYTE) * 4);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&err,"GLTF: Unsupported Component Type ",&local_31);
  std::__cxx11::string::push_back((char)&err);
  this = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  DeadlyImportError::DeadlyImportError(this,&err);
  __cxa_throw(this,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

inline unsigned int ComponentTypeSize(ComponentType t)
    {
        switch (t) {
            case ComponentType_SHORT:
            case ComponentType_UNSIGNED_SHORT:
                return 2;

            case ComponentType_UNSIGNED_INT:
            case ComponentType_FLOAT:
                return 4;

            case ComponentType_BYTE:
            case ComponentType_UNSIGNED_BYTE:
                return 1;
            default:
                std::string err = "GLTF: Unsupported Component Type ";
                err += t;
                throw DeadlyImportError(err);
        }
    }